

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

string * genId_abi_cxx11_(void)

{
  pointer pcVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *extraout_RAX;
  string *psVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  long *in_RDI;
  uint __len;
  string __str;
  string newid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  size_type local_40;
  _Alloc_hider local_38;
  
  gmlc::utilities::randomString_abi_cxx11_(0x2f6cfc);
  *(undefined1 *)&(local_48->_M_dataplus)._M_p = 0x2d;
  *(undefined1 *)((long)&(local_48->_M_dataplus)._M_p + 6) = 0x2d;
  *(undefined1 *)((long)&local_48->_M_string_length + 4) = 0x2d;
  (local_48->field_2)._M_local_buf[2] = '-';
  uVar4 = getpid();
  __val = -uVar4;
  if (0 < (int)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_002f6d75;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_002f6d75;
      }
      if (uVar7 < 10000) goto LAB_002f6d75;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_002f6d75:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_68,(ulong)(__len + -((int)uVar4 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68._M_dataplus._M_p + (uint)-((int)uVar4 >> 0x1f),__len,__val);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_68,(char *)local_48,local_40);
  *in_RDI = (long)(in_RDI + 2);
  pcVar1 = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    lVar2 = *(long *)((long)&pbVar5->field_2 + 8);
    in_RDI[2] = paVar8->_M_allocated_capacity;
    in_RDI[3] = lVar2;
  }
  else {
    *in_RDI = (long)pcVar1;
    in_RDI[2] = paVar8->_M_allocated_capacity;
  }
  in_RDI[1] = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  psVar6 = (string *)&local_38;
  if (local_48 != psVar6) {
    operator_delete(local_48,(ulong)(local_38._M_p + 1));
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

static inline std::string genId()
{
    std::string newid = gmlc::utilities::randomString(24);

    newid[0] = '-';
    newid[6] = '-';
    newid[12] = '-';
    newid[18] = '-';

#ifdef _WIN32
    std::string pid_str = std::to_string(GetCurrentProcessId()) + newid;
#else
    std::string pid_str = std::to_string(getpid()) + newid;
#endif
    return pid_str;
}